

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall ConstantExpression::ConstantExpression(ConstantExpression *this,SqObject *obj)

{
  int iVar1;
  uint value;
  string *str;
  float value_00;
  SqObject *obj_local;
  ConstantExpression *this_local;
  
  Expression::Expression(&this->super_Expression);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_GetType_001559f8;
  std::__cxx11::string::string((string *)&this->m_text);
  iVar1 = SqObject::GetType(obj);
  if (iVar1 != 0x1000001) {
    if (iVar1 == 0x5000002) {
      value = SqObject::GetInteger(obj);
      set(this,value);
      return;
    }
    if (iVar1 == 0x5000004) {
      value_00 = SqObject::GetFloat(obj);
      set(this,value_00);
      return;
    }
    if (iVar1 == 0x8000010) {
      str = SqObject::GetString_abi_cxx11_(obj);
      set(this,str);
      return;
    }
  }
  this->m_isLiteral = true;
  std::__cxx11::string::clear();
  return;
}

Assistant:

explicit ConstantExpression( const SqObject& obj )
	{
		switch(obj.GetType())
		{
			default:
			case SqObject::TypeNull:
				m_isLiteral = true;
				m_text.clear();
				break;

			case SqObject::TypeString:
				set(obj.GetString());
				break;

			case SqObject::TypeInteger:
				set(obj.GetInteger());
				break;

			case SqObject::TypeFloat:
				set(obj.GetFloat());
				break;
		}
	}